

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

void __thiscall GraphContigger::extend_to_repeats(GraphContigger *this,int max_size)

{
  bool bVar1;
  uint64_t uVar2;
  size_type sVar3;
  size_type sVar4;
  reference this_00;
  GraphEditor *__x;
  int in_ESI;
  NodeView NVar5;
  NodeView NVar6;
  NodeView NVar7;
  NodeView *in_stack_000000a8;
  LinkView *lp;
  iterator __end3;
  iterator __begin3;
  vector<LinkView,_std::allocator<LinkView>_> *__range3;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> through;
  GraphEditor *in_stack_00000170;
  bool b;
  sgNodeID_t fwn;
  NodeView nv;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<NodeView> *__range2;
  NodeView *fnv;
  iterator __end1;
  iterator __begin1;
  vector<NodeView,_std::allocator<NodeView>_> *__range1;
  GraphEditor ge;
  vector<LinkView,_std::allocator<LinkView>_> *in_stack_fffffffffffffc78;
  GraphEditor *in_stack_fffffffffffffc80;
  DistanceGraph *in_stack_fffffffffffffc88;
  sgNodeID_t in_stack_fffffffffffffc90;
  WorkSpace *in_stack_fffffffffffffcd8;
  undefined6 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  byte bVar8;
  undefined8 in_stack_fffffffffffffcf0;
  undefined2 uVar10;
  NodeView *pNVar9;
  DistanceGraph *in_stack_fffffffffffffcf8;
  NodeView *in_stack_fffffffffffffd18;
  NodeView local_2d8;
  long local_2c8;
  byte local_2b9;
  NodeView local_2b8;
  vector<NodeView,_std::allocator<NodeView>_> local_2a8;
  NodeView local_290;
  vector<LinkView,_std::allocator<LinkView>_> local_280;
  reference local_268;
  LinkView *local_260;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_> local_258;
  undefined1 local_250 [24];
  undefined1 *local_238;
  byte local_211;
  vector<LinkView,_std::allocator<LinkView>_> local_210;
  NodeView NVar11;
  GraphEditor *this_01;
  vector<LinkView,_std::allocator<LinkView>_> local_1d8;
  vector<LinkView,_std::allocator<LinkView>_> local_1c0;
  NodeView local_1a8;
  const_iterator local_198;
  const_iterator local_190;
  NodeView local_188;
  NodeView local_178;
  initializer_list<NodeView> local_160;
  initializer_list<NodeView> *local_150;
  reference local_148;
  undefined4 local_13c;
  NodeView *local_138;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_130 [3];
  undefined1 local_118 [24];
  undefined1 *local_100;
  int local_c;
  
  uVar10 = (undefined2)((ulong)in_stack_fffffffffffffcf0 >> 0x30);
  local_c = in_ESI;
  GraphEditor::GraphEditor
            ((GraphEditor *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)),
             in_stack_fffffffffffffcd8);
  DistanceGraph::get_all_nodeviews
            (in_stack_fffffffffffffcf8,SUB21((ushort)uVar10 >> 8,0),SUB21(uVar10,0));
  local_100 = local_118;
  local_130[0]._M_current =
       (NodeView *)
       std::vector<NodeView,_std::allocator<NodeView>_>::begin
                 ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffc78);
  local_138 = (NodeView *)
              std::vector<NodeView,_std::allocator<NodeView>_>::end
                        ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffc78);
  NVar7.dg = in_stack_fffffffffffffc88;
  NVar7.id = in_stack_fffffffffffffc90;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) {
      local_13c = 2;
      std::vector<NodeView,_std::allocator<NodeView>_>::~vector
                ((vector<NodeView,_std::allocator<NodeView>_> *)NVar7.id);
      GraphEditor::apply_all(in_stack_00000170);
      GraphEditor::~GraphEditor(in_stack_fffffffffffffc80);
      return;
    }
    local_148 = __gnu_cxx::
                __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
                operator*(local_130);
    local_188.id = local_148->id;
    local_188.dg = local_148->dg;
    pNVar9 = &local_178;
    NVar5 = NodeView::rc((NodeView *)0x4bdc42);
    *pNVar9 = NVar5;
    local_160._M_array = &local_188;
    local_160._M_len = 2;
    local_150 = &local_160;
    local_190 = std::initializer_list<NodeView>::begin(local_150);
    local_198 = std::initializer_list<NodeView>::end
                          ((initializer_list<NodeView> *)in_stack_fffffffffffffc80);
    for (; local_190 != local_198; local_190 = local_190 + 1) {
      local_1a8.id = local_190->id;
      local_1a8.dg = local_190->dg;
      uVar2 = NodeView::size((NodeView *)0x4bdcfc);
      if (uVar2 <= (ulong)(long)local_c) {
        NodeView::prev(in_stack_fffffffffffffd18);
        sVar3 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_1c0);
        bVar8 = true;
        if (1 < sVar3) {
          NodeView::next(in_stack_fffffffffffffd18);
          sVar4 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_1d8);
          bVar8 = sVar4 != 1;
        }
        if (1 < sVar3) {
          std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                    ((vector<LinkView,_std::allocator<LinkView>_> *)NVar7.id);
        }
        std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                  ((vector<LinkView,_std::allocator<LinkView>_> *)NVar7.id);
        if ((bVar8 & 1) == 0) {
          NodeView::next(in_stack_fffffffffffffd18);
          this_00 = std::vector<LinkView,_std::allocator<LinkView>_>::operator[](&local_210,0);
          NVar5 = LinkView::node(this_00);
          NVar11 = NVar5;
          __x = (GraphEditor *)NodeView::node_id((NodeView *)&stack0xfffffffffffffe08);
          std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                    ((vector<LinkView,_std::allocator<LinkView>_> *)NVar7.id);
          local_211 = 0;
          this_01 = __x;
          std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                    ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     0x4bdea1);
          NodeView::prev(in_stack_fffffffffffffd18);
          local_238 = local_250;
          local_258._M_current =
               (LinkView *)
               std::vector<LinkView,_std::allocator<LinkView>_>::begin(in_stack_fffffffffffffc78);
          local_260 = (LinkView *)
                      std::vector<LinkView,_std::allocator<LinkView>_>::end
                                (in_stack_fffffffffffffc78);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                                *)in_stack_fffffffffffffc80,
                               (__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                                *)in_stack_fffffffffffffc78);
            if (!bVar1) break;
            local_268 = __gnu_cxx::
                        __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                        ::operator*(&local_258);
            local_2b9 = 0;
            NVar6 = LinkView::node(local_268);
            local_290 = NVar6;
            NodeView::next(in_stack_fffffffffffffd18);
            sVar3 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_280);
            bVar1 = true;
            if (sVar3 < 2) {
              NVar6 = LinkView::node(local_268);
              local_2b8 = NVar6;
              NodeView::parallels(in_stack_000000a8);
              local_2b9 = 1;
              sVar3 = std::vector<NodeView,_std::allocator<NodeView>_>::size(&local_2a8);
              bVar1 = 1 < sVar3;
            }
            if ((local_2b9 & 1) != 0) {
              std::vector<NodeView,_std::allocator<NodeView>_>::~vector
                        ((vector<NodeView,_std::allocator<NodeView>_> *)NVar7.id);
            }
            std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                      ((vector<LinkView,_std::allocator<LinkView>_> *)NVar7.id);
            if (bVar1) {
              local_211 = 1;
              break;
            }
            NVar7 = LinkView::node(local_268);
            local_2d8 = NVar7;
            in_stack_fffffffffffffc80 = (GraphEditor *)NodeView::node_id(&local_2d8);
            local_2c8 = -(long)in_stack_fffffffffffffc80;
            std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
            emplace_back<long,long&>
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       NVar7.id,(long *)NVar7.dg,(long *)in_stack_fffffffffffffc80);
            __gnu_cxx::
            __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
            operator++(&local_258);
          }
          local_13c = 6;
          std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                    ((vector<LinkView,_std::allocator<LinkView>_> *)NVar7.id);
          if ((local_211 & 1) == 0) {
            in_stack_fffffffffffffc78 =
                 (vector<LinkView,_std::allocator<LinkView>_> *)NodeView::node_id(&local_1a8);
            std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       NVar5.dg,(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                 *)__x);
            GraphEditor::queue_node_expansion
                      (this_01,(sgNodeID_t)NVar11.dg,
                       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       NVar11.id);
            std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       NVar7.id);
            local_13c = 0;
          }
          else {
            local_13c = 5;
          }
          std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
                    ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     NVar7.id);
        }
      }
    }
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator++(local_130);
  } while( true );
}

Assistant:

void GraphContigger::extend_to_repeats(int max_size) {
    GraphEditor ge(ws);
    for (auto &fnv:ws.sdg.get_all_nodeviews()){
        for (auto nv:{fnv,fnv.rc()} ){
            if (nv.size()>max_size) continue;
            if (nv.prev().size()<2 or nv.next().size()!=1) continue;
            auto fwn=nv.next()[0].node().node_id();
            bool b=false;
            std::vector<std::pair<sgNodeID_t ,sgNodeID_t >> through;
            for (auto &lp:nv.prev()){
                if (lp.node().next().size()>1 or lp.node().parallels().size()>1){
                    b=true;
                    break;
                }
                through.emplace_back(-lp.node().node_id(),fwn);
            }
            if (b) continue;

            ge.queue_node_expansion(nv.node_id(),through);
        }
    }
    ge.apply_all();
//    def collapse_into_inputs(g,e, max_collapsed_size=500):
//    """Finds all nodes representing only shared sequence at the end of previous nodes, collapses back, only queues operations"""
//    for nvf in g.get_all_nodeviews():
//        for nv in [nvf,nvf.rc()]:
//            if nv.size()>max_collapsed_size: continue #don't expand large nodes
//            if len(nv.prev())<=1 or len(nv.next())!=1: continue
//            b=False
//            for lp in nv.prev():
//                if len(lp.node().next())>1 or len(lp.node().parallels())>1: #a single conflicted prev node skips the expansion, could be solved partially?
//                    b=True
//                    break#don't expand after a bubble
//            if b: continue
//            #TODO: tip check? is it even needed now?
//            #print([[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
//            e.queue_node_expansion(nv.node_id(),[[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
}